

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# week3-app1.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  long *plVar1;
  
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x1e);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,600);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0xf);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  plVar1 = (long *)std::ostream::operator<<((ostream *)&std::cout,0x32);
  std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
  std::ostream::put((char)plVar1);
  std::ostream::flush();
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
//    int(*func)(int, int);
    Func func;
    func = &add;

    int addition = run(10, 5, &add);

    int r1 = add(10, 20);
    int r2 = add(100, 200, 300);
    std::cout << r1 << std::endl;
    std::cout << r2 << std::endl;

//    int addition = add(10, 5);

    int product = run(10, 5, &multiply);
    std::cout << addition << std::endl;
    std::cout << product << std::endl;
    return 0;
}